

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfdcapi_common_CfdRequestExecuteJson_decodetx_Test::TestBody
          (cfdcapi_common_CfdRequestExecuteJson_decodetx_Test *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper local_60;
  AssertHelper local_58;
  int ret;
  AssertionResult gtest_ar;
  char *respons_json;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  void *handle;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  respons_json = (char *)((ulong)respons_json._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&respons_json,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&respons_json);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xb6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&respons_json);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&respons_json);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  respons_json = (char *)CONCAT71(respons_json._1_7_,handle != (void *)0x0);
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&respons_json,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xb7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_20);
  respons_json = (char *)0x0;
  ret = CfdRequestExecuteJson
                  (handle,"DecodeRawTransaction",
                   "{\"hex\":\"02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000\"}"
                   ,&respons_json);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xbe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (respons_json != (char *)0x0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_json1","respons_json",
               "{\"txid\":\"1fdeb34ff44d832a0064b57a4ec1d5ff4b6a64e2f65acafde071dff0dbd501ca\",\"hash\":\"1fdeb34ff44d832a0064b57a4ec1d5ff4b6a64e2f65acafde071dff0dbd501ca\",\"version\":2,\"size\":262,\"vsize\":262,\"weight\":1048,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295},{\"txid\":\"d2911125d6ce9fac819206b5f262caafd76c4ce2f5893b4e54320c6c4cd3dd81\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295},{\"txid\":\"d2911125d6ce9fac819206b5f262caafd76c4ce2f5893b4e54320c6c4cd3dd81\",\"vout\":1,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":2,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef\",\"hex\":\"0020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1qckhylutuasz4a9jt2umqzv5087relfzpu5l03zkdl4xcar0598hs4hsymp\"]}},{\"value\":21000000,\"n\":1,\"scriptPubKey\":{\"asm\":\"0 ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d2\",\"hex\":\"0020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d2\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1qafd8yzxdm77zphvnuy4l980tqzmgcptrs2jsy3rvn3d42jgf2nfqc4zt4j\"]}},{\"value\":123456789,\"n\":2,\"scriptPubKey\":{\"asm\":\"0 f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a42\",\"hex\":\"0020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a42\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1q7w0kyu46ddterr4sglzac38mgaf4dv8jfsf0egumry5yaqqq3fpqj93pax\"]}}]}"
               ,respons_json);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0xc0,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = (char *)0x0;
  ret = CfdRequestExecuteJson
                  (handle,"DecodeRawTransaction",
                   "{\"hex\":\"02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff0101000000000000002200201863143c14c5166804bd19203356da136c985678cd4d27a1b8c632960490326200000000\",\"network\":\"testnet\"}"
                   ,&respons_json);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xc9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (respons_json != (char *)0x0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_json2","respons_json",
               "{\"txid\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"hash\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"version\":2,\"size\":94,\"vsize\":94,\"weight\":376,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":1,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"hex\":\"00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7\"]}}]}"
               ,respons_json);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0xcb,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = (char *)0x0;
  ret = CfdRequestExecuteJson
                  (handle,"DecodeRawTransaction",
                   "{\"hex\":\"02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff0101000000000000002200201863143c14c5166804bd19203356da136c985678cd4d27a1b8c632960490326200000000\",\"network\":\"regtest\"}"
                   ,&respons_json);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xd4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (respons_json != (char *)0x0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_json3","respons_json",
               "{\"txid\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"hash\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"version\":2,\"size\":94,\"vsize\":94,\"weight\":376,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":1,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"hex\":\"00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bcrt1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3qzf4jry\"]}}]}"
               ,respons_json);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0xd6,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = (char *)0x0;
  ret = CfdRequestExecuteJson
                  (handle,"DecodeRawTransaction",
                   "{\"hex\":\"02000000000101ffa8db90b81db256874ff7a98fb7202cdc0b91b5b02d7c3427c4190adc66981f0000000000ffffffff0118f50295000000002251201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb02473044022018b10265080f8c491c43595000461a19212239fea9ee4c6fd26498f358b1760d0220223c1389ac26a2ed5f77ad73240af2fa6eb30ef5d19520026c2f7b7e817592530121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\",\"network\":\"regtest\"}"
                   ,&respons_json);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xdf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (respons_json != (char *)0x0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_json4","respons_json",
               "{\"txid\":\"2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916\",\"hash\":\"d95071dc758c623d7f2d91178f8b8ce1ee8272131ffedf510595fc4abe2960ad\",\"version\":2,\"size\":203,\"vsize\":122,\"weight\":485,\"locktime\":0,\"vin\":[{\"txid\":\"1f9866dc0a19c427347c2db0b5910bdc2c20b78fa9f74f8756b21db890dba8ff\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"txinwitness\":[\"3044022018b10265080f8c491c43595000461a19212239fea9ee4c6fd26498f358b1760d0220223c1389ac26a2ed5f77ad73240af2fa6eb30ef5d19520026c2f7b7e8175925301\",\"023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44\"],\"sequence\":4294967295}],\"vout\":[{\"value\":2499999000,\"n\":0,\"scriptPubKey\":{\"asm\":\"1 1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\",\"hex\":\"51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\",\"reqSigs\":1,\"type\":\"witness_v1_taproot\",\"addresses\":[\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"]}}]}"
               ,respons_json);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0xe1,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = (char *)0x0;
  ret = CfdRequestExecuteJson
                  (handle,"DecodeRawTransaction",
                   "{\"hex\":\"020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000\",\"network\":\"regtest\"}"
                   ,&respons_json);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (respons_json != (char *)0x0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_json5","respons_json",
               "{\"txid\":\"e4810312b04fcd7178f04153c08e9f065dbc3a2fcc27db77e76e4347d243f725\",\"hash\":\"dc8767a20b972967c1652436258500772fe93f5e0eae108fbb0a38c30e731c36\",\"version\":2,\"size\":284,\"vsize\":133,\"weight\":530,\"locktime\":0,\"vin\":[{\"txid\":\"195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"txinwitness\":[\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901\",\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\",\"c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54\"],\"sequence\":4294967295}],\"vout\":[{\"value\":2499998000,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 164e985d0fc92c927a66c0cbaf78e6ea389629d5\",\"hex\":\"0014164e985d0fc92c927a66c0cbaf78e6ea389629d5\",\"reqSigs\":1,\"type\":\"witness_v0_keyhash\",\"addresses\":[\"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40\"]}}]}"
               ,respons_json);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0xec,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = (char *)0x0;
  ret = CfdFreeHandle(handle);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xf2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdRequestExecuteJson_decodetx) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));
  char* respons_json = nullptr;

  // DecodeRawTransaction multiple input and output. (TxIn:2/TxOut:3)
  const char* request_json1 = "{\"hex\":\"02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000\"}";
  const char* exp_json1 = "{\"txid\":\"1fdeb34ff44d832a0064b57a4ec1d5ff4b6a64e2f65acafde071dff0dbd501ca\",\"hash\":\"1fdeb34ff44d832a0064b57a4ec1d5ff4b6a64e2f65acafde071dff0dbd501ca\",\"version\":2,\"size\":262,\"vsize\":262,\"weight\":1048,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295},{\"txid\":\"d2911125d6ce9fac819206b5f262caafd76c4ce2f5893b4e54320c6c4cd3dd81\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295},{\"txid\":\"d2911125d6ce9fac819206b5f262caafd76c4ce2f5893b4e54320c6c4cd3dd81\",\"vout\":1,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":2,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef\",\"hex\":\"0020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1qckhylutuasz4a9jt2umqzv5087relfzpu5l03zkdl4xcar0598hs4hsymp\"]}},{\"value\":21000000,\"n\":1,\"scriptPubKey\":{\"asm\":\"0 ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d2\",\"hex\":\"0020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d2\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1qafd8yzxdm77zphvnuy4l980tqzmgcptrs2jsy3rvn3d42jgf2nfqc4zt4j\"]}},{\"value\":123456789,\"n\":2,\"scriptPubKey\":{\"asm\":\"0 f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a42\",\"hex\":\"0020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a42\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bc1q7w0kyu46ddterr4sglzac38mgaf4dv8jfsf0egumry5yaqqq3fpqj93pax\"]}}]}";
  ret = CfdRequestExecuteJson(handle, "DecodeRawTransaction", request_json1, &respons_json);
  EXPECT_EQ(kCfdSuccess, ret);
  if (respons_json != nullptr) {
    EXPECT_STREQ(exp_json1, respons_json);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = NULL;

  // DecodeRawTransaction network (testnet)
  const char* request_json2 = "{\"hex\":\"02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff0101000000000000002200201863143c14c5166804bd19203356da136c985678cd4d27a1b8c632960490326200000000\",\"network\":\"testnet\"}";
  const char* exp_json2 = "{\"txid\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"hash\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"version\":2,\"size\":94,\"vsize\":94,\"weight\":376,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":1,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"hex\":\"00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7\"]}}]}";
  ret = CfdRequestExecuteJson(handle, "DecodeRawTransaction", request_json2, &respons_json);
  EXPECT_EQ(kCfdSuccess, ret);
  if (respons_json != nullptr) {
    EXPECT_STREQ(exp_json2, respons_json);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = NULL;

  // DecodeRawTransaction network (regtest)
  const char* request_json3 = "{\"hex\":\"02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff0101000000000000002200201863143c14c5166804bd19203356da136c985678cd4d27a1b8c632960490326200000000\",\"network\":\"regtest\"}";
  const char* exp_json3 = "{\"txid\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"hash\":\"6655abb87632ba0730ff5c4e3280a063cc7984be43d89c8e19d766996ff3d307\",\"version\":2,\"size\":94,\"vsize\":94,\"weight\":376,\"locktime\":0,\"vin\":[{\"txid\":\"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"sequence\":4294967295}],\"vout\":[{\"value\":1,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"hex\":\"00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262\",\"reqSigs\":1,\"type\":\"witness_v0_scripthash\",\"addresses\":[\"bcrt1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3qzf4jry\"]}}]}";
  ret = CfdRequestExecuteJson(handle, "DecodeRawTransaction", request_json3, &respons_json);
  EXPECT_EQ(kCfdSuccess, ret);
  if (respons_json != nullptr) {
    EXPECT_STREQ(exp_json3, respons_json);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = NULL;

  // DecodeRawTransaction taproot send
  const char* request_json4 = "{\"hex\":\"02000000000101ffa8db90b81db256874ff7a98fb7202cdc0b91b5b02d7c3427c4190adc66981f0000000000ffffffff0118f50295000000002251201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb02473044022018b10265080f8c491c43595000461a19212239fea9ee4c6fd26498f358b1760d0220223c1389ac26a2ed5f77ad73240af2fa6eb30ef5d19520026c2f7b7e817592530121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\",\"network\":\"regtest\"}";
  const char* exp_json4 = "{\"txid\":\"2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916\",\"hash\":\"d95071dc758c623d7f2d91178f8b8ce1ee8272131ffedf510595fc4abe2960ad\",\"version\":2,\"size\":203,\"vsize\":122,\"weight\":485,\"locktime\":0,\"vin\":[{\"txid\":\"1f9866dc0a19c427347c2db0b5910bdc2c20b78fa9f74f8756b21db890dba8ff\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"txinwitness\":[\"3044022018b10265080f8c491c43595000461a19212239fea9ee4c6fd26498f358b1760d0220223c1389ac26a2ed5f77ad73240af2fa6eb30ef5d19520026c2f7b7e8175925301\",\"023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44\"],\"sequence\":4294967295}],\"vout\":[{\"value\":2499999000,\"n\":0,\"scriptPubKey\":{\"asm\":\"1 1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\",\"hex\":\"51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\",\"reqSigs\":1,\"type\":\"witness_v1_taproot\",\"addresses\":[\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"]}}]}";
  ret = CfdRequestExecuteJson(handle, "DecodeRawTransaction", request_json4, &respons_json);
  EXPECT_EQ(kCfdSuccess, ret);
  if (respons_json != nullptr) {
    EXPECT_STREQ(exp_json4, respons_json);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = NULL;

  // DecodeRawTransaction tapscript
  const char* request_json5 = "{\"hex\":\"020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000\",\"network\":\"regtest\"}";
  const char* exp_json5 = "{\"txid\":\"e4810312b04fcd7178f04153c08e9f065dbc3a2fcc27db77e76e4347d243f725\",\"hash\":\"dc8767a20b972967c1652436258500772fe93f5e0eae108fbb0a38c30e731c36\",\"version\":2,\"size\":284,\"vsize\":133,\"weight\":530,\"locktime\":0,\"vin\":[{\"txid\":\"195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b\",\"vout\":0,\"scriptSig\":{\"asm\":\"\",\"hex\":\"\"},\"txinwitness\":[\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901\",\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\",\"c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54\"],\"sequence\":4294967295}],\"vout\":[{\"value\":2499998000,\"n\":0,\"scriptPubKey\":{\"asm\":\"0 164e985d0fc92c927a66c0cbaf78e6ea389629d5\",\"hex\":\"0014164e985d0fc92c927a66c0cbaf78e6ea389629d5\",\"reqSigs\":1,\"type\":\"witness_v0_keyhash\",\"addresses\":[\"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40\"]}}]}";
  ret = CfdRequestExecuteJson(handle, "DecodeRawTransaction", request_json5, &respons_json);
  EXPECT_EQ(kCfdSuccess, ret);
  if (respons_json != nullptr) {
    EXPECT_STREQ(exp_json5, respons_json);
    CfdFreeStringBuffer(respons_json);
  }
  respons_json = NULL;

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}